

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  XML_Convert_Result XVar2;
  char **ppcVar3;
  unsigned_short **ppuVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar5;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  unsigned_short *in_R8;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    ppcVar3 = (char **)ptr;
    iVar1 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)ptr);
    if ((iVar1 != 0) || (iVar1 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX,ppcVar3), iVar1 == 0)) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    pcVar5 = extraout_RDX_00;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    ppcVar3 = (char **)ptr;
    iVar1 = (*enc[3].literalScanners[1])(enc,ptr,end,(char **)ptr);
    if ((iVar1 != 0) || (iVar1 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar3), iVar1 == 0)
       ) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    pcVar5 = extraout_RDX_02;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    ppcVar3 = (char **)ptr;
    iVar1 = (*enc[3].nameMatchesAscii)(enc,ptr,end,ptr);
    if ((iVar1 != 0) || (iVar1 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_03,ppcVar3), iVar1 == 0)
       ) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    pcVar5 = extraout_RDX_04;
    break;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0x13:
    iVar1 = normal_scanCharRef(enc,ptr + 1,end,nextTokPtr);
    return iVar1;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    pcVar5 = end;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      ppuVar4 = (unsigned_short **)end_local;
      iVar1 = (*enc[3].literalScanners[0])(enc,end_local,pcVar5,(char **)end_local);
      if ((iVar1 != 0) ||
         (XVar2 = (*enc[2].utf16Convert)(enc,(char **)end_local,extraout_RDX_05,ppuVar4,in_R8),
         XVar2 == XML_CONVERT_COMPLETED)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
      pcVar5 = extraout_RDX_06;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      iVar1 = (*enc[3].literalScanners[1])(enc,end_local,pcVar5,(char **)end_local);
      if ((iVar1 != 0) || (iVar1 = (**(code **)&enc[2].minBytesPerChar)(enc,end_local), iVar1 == 0))
      {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 3;
      pcVar5 = extraout_RDX_07;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      ppcVar3 = (char **)end_local;
      iVar1 = (*enc[3].nameMatchesAscii)(enc,end_local,pcVar5,end_local);
      if ((iVar1 != 0) ||
         (iVar1 = (*enc[3].scanners[0])(enc,end_local,extraout_RDX_08,ppcVar3), iVar1 == 0)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 4;
      pcVar5 = extraout_RDX_09;
      break;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 0x12:
      *nextTokPtr = end_local + 1;
      return 9;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 1;
      break;
    case 0x1d:
      *nextTokPtr = end_local;
      return 0;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}